

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageDeleteFromIndex(Fts5Storage *p,i64 iDel,sqlite3_value **apVal)

{
  bool bVar1;
  int iVar2;
  int local_64;
  uchar *puStack_60;
  int nText;
  char *zText;
  Fts5InsertCtx ctx;
  int iCol;
  int rc2;
  int rc;
  sqlite3_stmt *pSeek;
  Fts5Config *pConfig;
  sqlite3_value **apVal_local;
  i64 iDel_local;
  Fts5Storage *p_local;
  
  pSeek = (sqlite3_stmt *)p->pConfig;
  _rc2 = (sqlite3_stmt *)0x0;
  pConfig = (Fts5Config *)apVal;
  apVal_local = (sqlite3_value **)iDel;
  iDel_local = (i64)p;
  if (apVal == (sqlite3_value **)0x0) {
    iVar2 = fts5StorageGetStmt(p,2,(sqlite3_stmt **)&rc2,(char **)0x0);
    if (iVar2 != 0) {
      return iVar2;
    }
    sqlite3_bind_int64(_rc2,1,(sqlite_int64)apVal_local);
    iVar2 = sqlite3_step(_rc2);
    if (iVar2 != 100) {
      iVar2 = sqlite3_reset(_rc2);
      return iVar2;
    }
  }
  zText = (char *)iDel_local;
  ctx.pStorage._0_4_ = 0xffffffff;
  iCol = sqlite3Fts5IndexBeginWrite(*(Fts5Index **)(iDel_local + 8),1,(i64)apVal_local);
  ctx.szCol = 1;
  while( true ) {
    bVar1 = false;
    if (iCol == 0) {
      bVar1 = ctx.szCol <= *(int *)(pSeek + 0x18);
    }
    if (!bVar1) break;
    if (*(char *)(*(long *)(pSeek + 0x28) + (long)(ctx.szCol + -1)) == '\0') {
      if (_rc2 == (sqlite3_stmt *)0x0) {
        puStack_60 = sqlite3_value_text((sqlite3_value *)(&pConfig->db)[ctx.szCol + -1]);
        local_64 = sqlite3_value_bytes((sqlite3_value *)(&pConfig->db)[ctx.szCol + -1]);
      }
      else {
        puStack_60 = sqlite3_column_text(_rc2,ctx.szCol);
        local_64 = sqlite3_column_bytes(_rc2,ctx.szCol);
      }
      ctx.pStorage._4_4_ = 0;
      iCol = sqlite3Fts5Tokenize((Fts5Config *)pSeek,4,(char *)puStack_60,local_64,&zText,
                                 fts5StorageInsertCallback);
      *(long *)(*(long *)(iDel_local + 0x20) + (long)(ctx.szCol + -1) * 8) =
           *(long *)(*(long *)(iDel_local + 0x20) + (long)(ctx.szCol + -1) * 8) -
           (long)ctx.pStorage._4_4_;
    }
    ctx.szCol = ctx.szCol + 1;
  }
  *(long *)(iDel_local + 0x18) = *(long *)(iDel_local + 0x18) + -1;
  iVar2 = sqlite3_reset(_rc2);
  if (iCol == 0) {
    iCol = iVar2;
  }
  return iCol;
}

Assistant:

static int fts5StorageDeleteFromIndex(
  Fts5Storage *p, 
  i64 iDel, 
  sqlite3_value **apVal
){
  Fts5Config *pConfig = p->pConfig;
  sqlite3_stmt *pSeek = 0;        /* SELECT to read row iDel from %_data */
  int rc;                         /* Return code */
  int rc2;                        /* sqlite3_reset() return code */
  int iCol;
  Fts5InsertCtx ctx;

  if( apVal==0 ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_LOOKUP, &pSeek, 0);
    if( rc!=SQLITE_OK ) return rc;
    sqlite3_bind_int64(pSeek, 1, iDel);
    if( sqlite3_step(pSeek)!=SQLITE_ROW ){
      return sqlite3_reset(pSeek);
    }
  }

  ctx.pStorage = p;
  ctx.iCol = -1;
  rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 1, iDel);
  for(iCol=1; rc==SQLITE_OK && iCol<=pConfig->nCol; iCol++){
    if( pConfig->abUnindexed[iCol-1]==0 ){
      const char *zText;
      int nText;
      if( pSeek ){
        zText = (const char*)sqlite3_column_text(pSeek, iCol);
        nText = sqlite3_column_bytes(pSeek, iCol);
      }else{
        zText = (const char*)sqlite3_value_text(apVal[iCol-1]);
        nText = sqlite3_value_bytes(apVal[iCol-1]);
      }
      ctx.szCol = 0;
      rc = sqlite3Fts5Tokenize(pConfig, FTS5_TOKENIZE_DOCUMENT, 
          zText, nText, (void*)&ctx, fts5StorageInsertCallback
      );
      p->aTotalSize[iCol-1] -= (i64)ctx.szCol;
    }
  }
  p->nTotalRow--;

  rc2 = sqlite3_reset(pSeek);
  if( rc==SQLITE_OK ) rc = rc2;
  return rc;
}